

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O0

TRef fold_simplify_intsub_k64(jit_State *J)

{
  uint64_t u64;
  TRef TVar1;
  jit_State *in_RDI;
  uint64_t k;
  uint local_4;
  
  u64 = *(uint64_t *)(ulong)(in_RDI->fold).right.field_1.op12;
  if (u64 == 0) {
    local_4 = (uint)(in_RDI->fold).ins.field_0.op1;
  }
  else {
    (in_RDI->fold).ins.field_1.o = '(';
    TVar1 = lj_ir_kint64(in_RDI,u64);
    (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar1;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

LJFOLD(SUB any KINT64)
LJFOLDF(simplify_intsub_k64)
{
  uint64_t k = ir_kint64(fright)->u64;
  if (k == 0)  /* i - 0 ==> i */
    return LEFTFOLD;
  fins->o = IR_ADD;  /* i - k ==> i + (-k) */
  fins->op2 = (IRRef1)lj_ir_kint64(J, (uint64_t)-(int64_t)k);
  return RETRYFOLD;
}